

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.h
# Opt level: O1

void __thiscall
pbrt::SurfaceInteraction::SetShadingGeometry
          (SurfaceInteraction *this,Normal3f *ns,Vector3f *dpdus,Vector3f *dpdvs,Normal3f *dndus,
          Normal3f *dndvs,bool orientationIsAuthoritative)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  undefined8 uVar8;
  bool bVar9;
  long lVar10;
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.z =
       (ns->super_Tuple3<pbrt::Normal3,_float>).z;
  fVar1 = (ns->super_Tuple3<pbrt::Normal3,_float>).y;
  (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.x =
       (ns->super_Tuple3<pbrt::Normal3,_float>).x;
  (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.y = fVar1;
  if (orientationIsAuthoritative) {
    uVar4._0_4_ = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
    uVar4._4_4_ = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar4;
    fVar1 = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
    fVar2 = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar7 = vmovshdup_avx(auVar12);
    auVar15 = ZEXT416((uint)(fVar1 * fVar2));
    auVar7 = vfmadd132ss_fma(auVar7,auVar15,
                             ZEXT416((uint)(this->shading).n.super_Tuple3<pbrt::Normal3,_float>.y));
    auVar15 = vfmsub213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar1),auVar15);
    auVar7 = vfmadd132ss_fma(auVar12,ZEXT416((uint)(auVar7._0_4_ + auVar15._0_4_)),
                             ZEXT416((uint)(this->shading).n.super_Tuple3<pbrt::Normal3,_float>.x));
    auVar16._0_12_ = ZEXT812(0);
    auVar16._12_4_ = 0;
    if (auVar7._0_4_ < 0.0) {
      auVar12._0_8_ = uVar4 ^ 0x8000000080000000;
      auVar12._8_4_ = 0x80000000;
      auVar12._12_4_ = 0x80000000;
    }
    uVar8 = vcmpss_avx512f(auVar7,auVar16,1);
    bVar9 = (bool)((byte)uVar8 & 1);
    iVar11 = (uint)bVar9 * (int)-fVar1 + (uint)!bVar9 * (int)fVar1;
    uVar8 = vmovlps_avx(auVar12);
    (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar8;
    (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y =
         (float)(int)((ulong)uVar8 >> 0x20);
    lVar10 = 0x30;
  }
  else {
    uVar5._0_4_ = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
    uVar5._4_4_ = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar5;
    fVar1 = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
    fVar2 = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar7 = vmovshdup_avx(auVar13);
    auVar15 = ZEXT416((uint)(fVar1 * fVar2));
    auVar7 = vfmadd132ss_fma(auVar7,auVar15,
                             ZEXT416((uint)(this->super_Interaction).n.
                                           super_Tuple3<pbrt::Normal3,_float>.y));
    auVar15 = vfmsub213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar1),auVar15);
    auVar7 = vfmadd132ss_fma(auVar13,ZEXT416((uint)(auVar7._0_4_ + auVar15._0_4_)),
                             ZEXT416((uint)(this->super_Interaction).n.
                                           super_Tuple3<pbrt::Normal3,_float>.x));
    auVar15._0_12_ = ZEXT812(0);
    auVar15._12_4_ = 0;
    if (auVar7._0_4_ < 0.0) {
      auVar13._0_8_ = uVar5 ^ 0x8000000080000000;
      auVar13._8_4_ = 0x80000000;
      auVar13._12_4_ = 0x80000000;
    }
    uVar8 = vcmpss_avx512f(auVar7,auVar15,1);
    bVar9 = (bool)((byte)uVar8 & 1);
    iVar11 = (uint)bVar9 * (int)-fVar1 + (uint)!bVar9 * (int)fVar1;
    uVar8 = vmovlps_avx(auVar13);
    (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar8;
    (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar8 >> 0x20);
    lVar10 = 0x88;
  }
  *(int *)((long)&(this->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low + lVar10) = iVar11;
  (this->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.z =
       (dpdus->super_Tuple3<pbrt::Vector3,_float>).z;
  fVar1 = (dpdus->super_Tuple3<pbrt::Vector3,_float>).y;
  (this->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.x =
       (dpdus->super_Tuple3<pbrt::Vector3,_float>).x;
  (this->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.y = fVar1;
  (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.z =
       (dpdvs->super_Tuple3<pbrt::Vector3,_float>).z;
  fVar1 = (dpdvs->super_Tuple3<pbrt::Vector3,_float>).y;
  (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.x =
       (dpdvs->super_Tuple3<pbrt::Vector3,_float>).x;
  (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.y = fVar1;
  (this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.z =
       (dndus->super_Tuple3<pbrt::Normal3,_float>).z;
  fVar1 = (dndus->super_Tuple3<pbrt::Normal3,_float>).y;
  (this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.x =
       (dndus->super_Tuple3<pbrt::Normal3,_float>).x;
  (this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.y = fVar1;
  (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.z =
       (dndvs->super_Tuple3<pbrt::Normal3,_float>).z;
  fVar1 = (dndvs->super_Tuple3<pbrt::Normal3,_float>).y;
  (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.x =
       (dndvs->super_Tuple3<pbrt::Normal3,_float>).x;
  (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.y = fVar1;
  auVar7._0_12_ = *(undefined1 (*) [12])&(this->shading).dpdu;
  auVar7._12_4_ = (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.x;
  uVar3 = (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.y;
  uVar6 = (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar14._4_4_ = uVar6;
  auVar14._0_4_ = uVar3;
  auVar14._8_8_ = 0;
  auVar17._8_4_ = 0x4cbebc20;
  auVar17._0_8_ = 0x4cbebc204cbebc20;
  auVar17._12_4_ = 0x4cbebc20;
  do {
    auVar18._0_4_ = auVar7._0_4_ * auVar7._0_4_;
    auVar18._4_4_ = auVar7._4_4_ * auVar7._4_4_;
    auVar18._8_4_ = auVar7._8_4_ * auVar7._8_4_;
    auVar18._12_4_ = auVar7._12_4_ * auVar7._12_4_;
    auVar15 = vmovshdup_avx(auVar18);
    auVar13 = vfmadd231ss_fma(auVar15,auVar7,auVar7);
    auVar15 = vshufpd_avx(auVar7,auVar7,1);
    auVar15 = vfmadd213ss_fma(auVar15,auVar15,auVar13);
    if (auVar15._0_4_ <= 1e+16) {
      auVar15 = vshufps_avx(auVar7,auVar7,0xff);
      auVar13 = vfmadd213ss_fma(auVar15,auVar15,ZEXT416((uint)(auVar14._0_4_ * auVar14._0_4_)));
      auVar15 = vmovshdup_avx(auVar14);
      auVar15 = vfmadd213ss_fma(auVar15,auVar15,auVar13);
      if (auVar15._0_4_ <= 1e+16) {
        return;
      }
    }
    auVar7 = vdivps_avx(auVar7,auVar17);
    (this->shading).dpdu = (Vector3f)auVar7._0_12_;
    (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar7._12_4_;
    auVar14 = vdivps_avx(auVar14,auVar17);
    uVar8 = vmovlps_avx(auVar14);
    (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)uVar8;
    (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.z = (float)(int)((ulong)uVar8 >> 0x20);
  } while( true );
}

Assistant:

PBRT_CPU_GPU
    void SetShadingGeometry(const Normal3f &ns, const Vector3f &dpdus,
                            const Vector3f &dpdvs, const Normal3f &dndus,
                            const Normal3f &dndvs, bool orientationIsAuthoritative) {
        // Compute _shading.n_ for _SurfaceInteraction_
        shading.n = ns;
        DCHECK_NE(shading.n, Normal3f(0, 0, 0));
        if (orientationIsAuthoritative)
            n = FaceForward(n, shading.n);
        else
            shading.n = FaceForward(shading.n, n);

        // Initialize _shading_ partial derivative values
        shading.dpdu = dpdus;
        shading.dpdv = dpdvs;
        shading.dndu = dndus;
        shading.dndv = dndvs;
        while (LengthSquared(shading.dpdu) > 1e16f ||
               LengthSquared(shading.dpdv) > 1e16f) {
            shading.dpdu /= 1e8f;
            shading.dpdv /= 1e8f;
        }
    }